

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  string c;
  string p;
  allocator<char> aaStack_48 [32];
  string local_28 [32];
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>(local_28,argv[1],aaStack_48);
    R5R::Decrypt((string *)aaStack_48);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)aaStack_48);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)aaStack_48);
    std::__cxx11::string::~string(local_28);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage: r5r-dec <ciphertext>");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc == 2)
    {
        string p = argv[1];
        string c = R5R::Decrypt(p);
        cout << c << endl;
    }
    else
    {
        cout << "Usage: r5r-dec <ciphertext>" << endl;
    }
    return 0;
}